

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::handleFtpCommandLIST(FtpSession *this,string *param)

{
  element_type *peVar1;
  bool bVar2;
  FileType FVar3;
  FileStatus *this_00;
  allocator local_149;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
  local_148;
  string path2dst;
  string local_path;
  FileStatus dir_status;
  
  peVar1 = (this->logged_in_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    ::std::__cxx11::string::string((string *)&dir_status,"Not logged in",(allocator *)&local_148);
    sendFtpMessage(this,NOT_LOGGED_IN,&dir_status.path_);
  }
  else {
    if ((peVar1->permissions_ & DirList) != None) {
      path2dst._M_dataplus._M_p = (pointer)&path2dst.field_2;
      path2dst._M_string_length = 0;
      path2dst.field_2._M_local_buf[0] = '\0';
      bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )param,"-a");
      if (bVar2) {
LAB_00115116:
        ::std::__cxx11::string::assign((char *)&path2dst);
      }
      else {
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)param,"-l");
        if (bVar2) goto LAB_00115116;
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)param,"-al");
        if (bVar2) goto LAB_00115116;
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)param,"-la");
        if (bVar2) goto LAB_00115116;
        ::std::__cxx11::string::substr((ulong)&dir_status,(ulong)param);
        bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&dir_status,"-a ");
        if (bVar2) {
          bVar2 = 3 < param->_M_string_length;
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_148,(ulong)param);
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&local_148,"-l ");
          bVar2 = 3 < param->_M_string_length && bVar2;
          ::std::__cxx11::string::~string((string *)&local_148);
        }
        ::std::__cxx11::string::~string((string *)&dir_status);
        if (bVar2) {
          ::std::__cxx11::string::substr((ulong)&dir_status,(ulong)param);
LAB_001153d6:
          ::std::__cxx11::string::operator=((string *)&path2dst,(string *)&dir_status);
          ::std::__cxx11::string::~string((string *)&dir_status);
        }
        else {
          ::std::__cxx11::string::substr((ulong)&dir_status,(ulong)param);
          bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&dir_status,"-al ");
          if (bVar2) {
            bVar2 = 4 < param->_M_string_length;
          }
          else {
            ::std::__cxx11::string::substr((ulong)&local_148,(ulong)param);
            bVar2 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&local_148,"-la ");
            bVar2 = 4 < param->_M_string_length && bVar2;
            ::std::__cxx11::string::~string((string *)&local_148);
          }
          ::std::__cxx11::string::~string((string *)&dir_status);
          if (bVar2) {
            ::std::__cxx11::string::substr((ulong)&dir_status,(ulong)param);
            goto LAB_001153d6;
          }
          ::std::__cxx11::string::_M_assign((string *)&path2dst);
        }
      }
      toLocalPath(&local_path,this,&path2dst);
      Filesystem::FileStatus::FileStatus(&dir_status,(string *)&local_path);
      bVar2 = Filesystem::FileStatus::isOk(&dir_status);
      if (bVar2) {
        FVar3 = Filesystem::FileStatus::type(&dir_status);
        if (FVar3 != Dir) {
          ::std::__cxx11::string::string((string *)&local_148,"Path is not a directory",&local_149);
          sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)&local_148);
          goto LAB_00115264;
        }
        bVar2 = Filesystem::FileStatus::canOpenDir(&dir_status);
        if (!bVar2) {
          ::std::__cxx11::string::string((string *)&local_148,"Permission denied",&local_149);
          sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)&local_148);
          goto LAB_00115264;
        }
        ::std::__cxx11::string::string((string *)&local_148,"Sending directory listing",&local_149);
        sendFtpMessage(this,FILE_STATUS_OK_OPENING_DATA_CONNECTION,(string *)&local_148);
        ::std::__cxx11::string::~string((string *)&local_148);
        Filesystem::dirContent
                  ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                    *)&local_148,(string *)&local_path);
        sendDirectoryListing
                  (this,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
                         *)&local_148);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fineftp::Filesystem::FileStatus>_>_>
        ::~_Rb_tree(&local_148);
      }
      else {
        ::std::__cxx11::string::string((string *)&local_148,"Path does not exist",&local_149);
        sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,(string *)&local_148);
LAB_00115264:
        ::std::__cxx11::string::~string((string *)&local_148);
      }
      Filesystem::FileStatus::~FileStatus(&dir_status);
      ::std::__cxx11::string::~string((string *)&local_path);
      this_00 = (FileStatus *)&path2dst;
      goto LAB_0011528a;
    }
    ::std::__cxx11::string::string
              ((string *)&dir_status,"Permission denied",(allocator *)&local_148);
    sendFtpMessage(this,FILE_ACTION_NOT_TAKEN,&dir_status.path_);
  }
  this_00 = &dir_status;
LAB_0011528a:
  ::std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void FtpSession::handleFtpCommandLIST(const std::string& param)
  {
    if (!logged_in_user_)
    {
      sendFtpMessage(FtpReplyCode::NOT_LOGGED_IN,    "Not logged in");
      return;
    }

    // RFC 959 does not allow ACTION_NOT_TAKEN (-> permanent error), so we return a temporary error (FILE_ACTION_NOT_TAKEN).
    if (static_cast<int>(logged_in_user_->permissions_ & Permission::DirList) == 0)
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
      return;
    }

    // Deal with some unusual commands like "LIST -a", "LIST -a dirname".
    // Some FTP clients send those commands, as if they would call ls on unix.
    // 
    // We try to support those parameters (or rather ignore them), even though
    // this techniqually breaks listing directories that actually use "-a" etc.
    // as directory name. As most clients however first CWD into a directory and
    // call LIST without parameter afterwards and starting a directory name with
    // "-a " / "-l " / "-al " / "-la " is not that common, the compatibility
    // benefit should outperform te potential problems by a lot.
    // 
    // The RFC-violating LIST command now shall be:
    // 
    //   LIST [<SP> <arg>] [<SP> <pathname>] <CRLF>
    // 
    //   with:
    // 
    //     <arg> ::= -a
    //             | -l
    //             | -al
    //             | -la
    //

    std::string path2dst;
    if ((param == "-a") || (param == "-l") || (param == "-al") || (param == "-la"))
    {
      path2dst  = "";
    }
    else if ((param.substr(0, 3)=="-a "|| param.substr(0, 3)=="-l ") && (param.size() > 3))
    {
      path2dst = param.substr(3);
    }
    else if ((param.substr(0, 4) == "-al " || param.substr(0, 4) == "-la ") && (param.size() > 4))
    {
      path2dst = param.substr(4);
    }
    else
    {
      path2dst = param;
    }

    std::string local_path = toLocalPath(path2dst);
    auto dir_status = Filesystem::FileStatus(local_path);

    if (dir_status.isOk())
    {
      if (dir_status.type() == Filesystem::FileType::Dir)
      {
        if (dir_status.canOpenDir())
        {
          sendFtpMessage(FtpReplyCode::FILE_STATUS_OK_OPENING_DATA_CONNECTION, "Sending directory listing");
          sendDirectoryListing(Filesystem::dirContent(local_path));
          return;
        }
        else
        {
          sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Permission denied");
          return;
        }
      }
      else
      {
        // TODO: RFC959: If the pathname specifies a file then the server should send current information on the file.
        sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path is not a directory");
        return;
      }
    }
    else
    {
      sendFtpMessage(FtpReplyCode::FILE_ACTION_NOT_TAKEN, "Path does not exist");
      return;
    }
  }